

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O2

void pcs_ready(PrimeCandidateSource *s)

{
  size_t *allocated;
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint uVar4;
  uint32_t uVar5;
  uintmax_t uVar6;
  avoid *paVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  size_t i;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  avoid aVar22;
  
  init_smallprimes();
  uVar4 = mp_hs_integer(s->addend,0x10000);
  uVar20 = 0x10000;
  if (uVar4 == 0) {
    uVar6 = mp_get_integer(s->addend);
    uVar20 = (uint)uVar6;
  }
  allocated = &s->avoidsize;
  for (lVar18 = 0; (lVar18 != 0x198e && (smallprimes_array[lVar18] < uVar20)); lVar18 = lVar18 + 1)
  {
    paVar7 = (avoid *)safegrowarray(s->avoids,allocated,8,s->navoids,1,false);
    s->avoids = paVar7;
    sVar8 = s->navoids;
    paVar7[sVar8].mod = (uint)smallprimes_array[lVar18];
    paVar7[sVar8].res = 0;
    s->navoids = sVar8 + 1;
  }
  if (s->try_sophie_germain == true) {
    for (lVar18 = 0; (lVar18 != 0x198e && (smallprimes_array[lVar18] < uVar20)); lVar18 = lVar18 + 1
        ) {
      if (smallprimes_array[lVar18] != 2) {
        paVar7 = (avoid *)safegrowarray(s->avoids,allocated,8,s->navoids,1,false);
        s->avoids = paVar7;
        uVar3 = smallprimes_array[lVar18];
        sVar8 = s->navoids;
        paVar7[sVar8].mod = (uint)uVar3;
        paVar7[sVar8].res = (int)(uVar3 - 1) / 2;
        s->navoids = sVar8 + 1;
      }
    }
  }
  paVar7 = s->avoids;
  sVar8 = s->navoids;
  if (s->avoid_modulus != 0) {
    paVar7 = (avoid *)safegrowarray(paVar7,allocated,8,sVar8,1,false);
    s->avoids = paVar7;
    sVar8 = s->navoids;
    uVar1 = s->avoid_residue;
    uVar2 = s->avoid_modulus;
    aVar22.res = uVar1;
    aVar22.mod = uVar2;
    paVar7[sVar8] = aVar22;
    sVar8 = sVar8 + 1;
    s->navoids = sVar8;
  }
  qsort(paVar7,sVar8,8,avoid_cmp);
  uVar10 = 0;
  uVar12 = 0;
  uVar13 = 0;
  sVar8 = 0;
  uVar17 = 0;
  do {
    if (s->navoids <= uVar17) {
      s->navoids = sVar8;
      s->ready = true;
      return;
    }
    uVar4 = s->avoids[uVar17].mod;
    uVar21 = (ulong)uVar4;
    uVar19 = (ulong)s->avoids[uVar17].res;
    if (uVar13 != uVar21) {
      uVar5 = mp_mod_known_integer(s->addend,uVar4);
      uVar12 = (ulong)uVar5;
      uVar5 = mp_mod_known_integer(s->factor,uVar4);
      uVar10 = (ulong)uVar5;
      uVar13 = uVar21;
    }
    if (uVar10 == 0) {
      if (uVar19 == uVar12) {
        __assert_fail("res != addend_m",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                      ,0x15d,"void pcs_ready(PrimeCandidateSource *)");
      }
    }
    else {
      uVar9 = uVar21;
      lVar18 = 0;
      lVar14 = 1;
      uVar15 = uVar10;
      while (uVar15 != 0) {
        lVar16 = lVar18 - ((long)uVar9 / (long)uVar15) * lVar14;
        uVar11 = (long)uVar9 % (long)uVar15;
        uVar9 = uVar15;
        lVar18 = lVar14;
        lVar14 = lVar16;
        uVar15 = uVar11;
      }
      if ((uVar9 != 0xffffffffffffffff) && (uVar9 != 1)) {
        __assert_fail("v1 == 1 || v1 == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                      ,0xff,"uint64_t invert(uint64_t, uint64_t)");
      }
      lVar18 = (long)(uVar9 * lVar18 * (uVar19 - uVar12)) % (long)uVar21;
      paVar7 = s->avoids;
      paVar7[sVar8].mod = uVar4;
      paVar7[sVar8].res = (int)lVar18 + ((uint)(lVar18 >> 0x3f) & uVar4);
      sVar8 = sVar8 + 1;
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void pcs_ready(PrimeCandidateSource *s)
{
    /*
     * List all the small (modulus, residue) pairs we want to avoid.
     */

    init_smallprimes();

#define ADD_AVOID(newmod, newres) do {                          \
        sgrowarray(s->avoids, s->avoidsize, s->navoids);        \
        s->avoids[s->navoids].mod = (newmod);                   \
        s->avoids[s->navoids].res = (newres);                   \
        s->navoids++;                                           \
    } while (0)

    unsigned limit = (mp_hs_integer(s->addend, 65536) ? 65536 :
                      mp_get_integer(s->addend));

    /*
     * Don't be divisible by any small prime, or at least, any prime
     * smaller than our output number might actually manage to be. (If
     * asked to generate a really small prime, it would be
     * embarrassing to rule out legitimate answers on the grounds that
     * they were divisible by themselves.)
     */
    for (size_t i = 0; i < NSMALLPRIMES && smallprimes[i] < limit; i++)
        ADD_AVOID(smallprimes[i], 0);

    if (s->try_sophie_germain) {
        /*
         * If we're aiming to generate a Sophie Germain prime (i.e. p
         * such that 2p+1 is also prime), then we also want to ensure
         * 2p+1 is not congruent to 0 mod any small prime, because if
         * it is, we'll waste a lot of time generating a p for which
         * 2p+1 can't possibly work. So we have to avoid an extra
         * residue mod each odd q.
         *
         * We can simplify:        2p+1 ==  0      (mod q)
         *                    =>     2p == -1      (mod q)
         *                    =>      p == -2^{-1} (mod q)
         *
         * There's no need to do Euclid's algorithm to compute those
         * inverses, because for any odd q, the modular inverse of -2
         * mod q is just (q-1)/2. (Proof: multiplying it by -2 gives
         * 1-q, which is congruent to 1 mod q.)
         */
        for (size_t i = 0; i < NSMALLPRIMES && smallprimes[i] < limit; i++)
            if (smallprimes[i] != 2)
                ADD_AVOID(smallprimes[i], (smallprimes[i] - 1) / 2);
    }

    /*
     * Finally, if there's a particular modulus and residue we've been
     * told to avoid, put it on the list.
     */
    if (s->avoid_modulus)
        ADD_AVOID(s->avoid_modulus, s->avoid_residue);

#undef ADD_AVOID

    /*
     * Sort our to-avoid list by modulus. Partly this is so that we'll
     * check the smaller moduli first during the live runs, which lets
     * us spot most failing cases earlier rather than later. Also, it
     * brings equal moduli together, so that we can reuse the residue
     * we computed from a previous one.
     */
    qsort(s->avoids, s->navoids, sizeof(*s->avoids), avoid_cmp);

    /*
     * Next, adjust each of these moduli to take account of our factor
     * and addend. If we want factor*x+addend to avoid being congruent
     * to 'res' modulo 'mod', then x itself must avoid being congruent
     * to (res - addend) * factor^{-1}.
     *
     * If factor == 0 modulo mod, then the answer will have a fixed
     * residue anyway, so we can discard it from our list to test.
     */
    int64_t factor_m = 0, addend_m = 0, last_mod = 0;

    size_t out = 0;
    for (size_t i = 0; i < s->navoids; i++) {
        int64_t mod = s->avoids[i].mod, res = s->avoids[i].res;
        if (mod != last_mod) {
            last_mod = mod;
            addend_m = mp_mod_known_integer(s->addend, mod);
            factor_m = mp_mod_known_integer(s->factor, mod);
        }

        if (factor_m == 0) {
            assert(res != addend_m);
            continue;
        }

        res = (res - addend_m) * invert(factor_m, mod);
        res %= mod;
        if (res < 0)
            res += mod;

        s->avoids[out].mod = mod;
        s->avoids[out].res = res;
        out++;
    }

    s->navoids = out;

    s->ready = true;
}